

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

_Bool clone_bytes(uchar **dst,uchar *src,size_t len)

{
  uchar *__dest;
  _Bool _Var1;
  
  if (len == 0) {
    *dst = (uchar *)0x0;
    _Var1 = true;
  }
  else {
    __dest = (uchar *)wally_malloc(len);
    *dst = __dest;
    if (__dest != (uchar *)0x0) {
      memcpy(__dest,src,len);
    }
    _Var1 = *dst != (uchar *)0x0;
  }
  return _Var1;
}

Assistant:

bool clone_bytes(unsigned char **dst, const unsigned char *src, size_t len)
{
    return clone_data((void **)dst, src, len);
}